

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> * __thiscall
docopt::BranchPattern::flat(BranchPattern *this,_func_bool_Pattern_ptr *filter)

{
  initializer_list<docopt::Pattern_*> __l;
  bool bVar1;
  ulong uVar2;
  element_type *peVar3;
  iterator this_00;
  code *in_RDX;
  long in_RSI;
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *in_RDI;
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> sublist;
  shared_ptr<docopt::Pattern> *child;
  iterator __end2;
  iterator __begin2;
  PatternList *__range2;
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *ret;
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *in_stack_ffffffffffffff28;
  iterator in_stack_ffffffffffffff30;
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *this_01;
  allocator_type *in_stack_ffffffffffffff58;
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff68;
  size_type in_stack_ffffffffffffff70;
  __normal_iterator<docopt::Pattern_**,_std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<docopt::Pattern_**,_std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>_>
  in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff88;
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_58;
  long local_50;
  undefined1 local_45;
  undefined1 local_30 [8];
  undefined1 *local_28;
  undefined8 local_20;
  code *local_18;
  
  this_01 = in_RDI;
  local_18 = in_RDX;
  uVar2 = (*in_RDX)();
  if ((uVar2 & 1) == 0) {
    local_45 = 0;
    std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::vector
              ((vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)0x2c24ef);
    local_50 = in_RSI + 8;
    local_58._M_current =
         (shared_ptr<docopt::Pattern> *)
         std::
         vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ::begin((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)in_stack_ffffffffffffff28);
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    end((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         *)in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                               *)in_stack_ffffffffffffff30._M_current,
                              (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
      ::operator*(&local_58);
      peVar3 = std::__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2c255e);
      (**peVar3->_vptr_Pattern)(&stack0xffffffffffffff80,peVar3,local_18);
      this_00 = std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::end
                          (in_stack_ffffffffffffff28);
      __gnu_cxx::
      __normal_iterator<docopt::Pattern*const*,std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>>
      ::__normal_iterator<docopt::Pattern**>
                ((__normal_iterator<docopt::Pattern_*const_*,_std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>_>
                  *)in_stack_ffffffffffffff30._M_current,
                 (__normal_iterator<docopt::Pattern_**,_std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>_>
                  *)in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff28 =
           (vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)&stack0xffffffffffffff80
      ;
      std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::begin
                (in_stack_ffffffffffffff28);
      std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::end
                (in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff30 =
           std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>::
           insert<__gnu_cxx::__normal_iterator<docopt::Pattern**,std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>>,void>
                     (this_00._M_current,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                      in_stack_ffffffffffffff78);
      std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::~vector(this_01);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
      ::operator++(&local_58);
    }
  }
  else {
    local_28 = local_30;
    local_20 = 1;
    std::allocator<docopt::Pattern_*>::allocator((allocator<docopt::Pattern_*> *)0x2c2484);
    __l._M_len = in_stack_ffffffffffffff70;
    __l._M_array = in_stack_ffffffffffffff68;
    std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::vector
              (in_stack_ffffffffffffff60,__l,in_stack_ffffffffffffff58);
    std::allocator<docopt::Pattern_*>::~allocator((allocator<docopt::Pattern_*> *)0x2c24b2);
  }
  return in_RDI;
}

Assistant:

virtual std::vector<Pattern*> flat(bool (*filter)(Pattern const*)) override {
			if (filter(this)) {
				return {this};
			}
			
			std::vector<Pattern*> ret;
			for(auto& child : fChildren) {
				auto sublist = child->flat(filter);
				ret.insert(ret.end(), sublist.begin(), sublist.end());
			}
			return ret;
		}